

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionManager.cpp
# Opt level: O0

SelectionManager * __thiscall
OpenMD::SelectionManager::replaceRigidBodiesWithAtoms(SelectionManager *this)

{
  StuntDouble *this_00;
  SelectionManager *in_RSI;
  SelectionManager *in_RDI;
  RigidBody *rb;
  Atom *atom;
  iterator ai;
  int isd;
  StuntDouble *sd;
  SelectionSet ssRBs;
  SelectionSet ssAtoms;
  SelectionManager *tempSeleMan;
  StuntDouble *in_stack_fffffffffffffee8;
  reference in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  SelectionManager *in_stack_ffffffffffffff00;
  reference in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  SelectionManager *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  SelectionManager *local_a8;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_a0 [2];
  StuntDouble *local_90;
  undefined1 local_81;
  vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> local_68 [2];
  vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> local_28;
  
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_RSI,(vector<int,_std::allocator<int>_> *)in_RDI
            );
  SelectionSet::SelectionSet((SelectionSet *)in_RSI,(vector<int,_std::allocator<int>_> *)in_RDI);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff00);
  SelectionSet::clearAll((SelectionSet *)in_stack_fffffffffffffef0);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_RSI,(vector<int,_std::allocator<int>_> *)in_RDI
            );
  SelectionSet::SelectionSet((SelectionSet *)in_RSI,(vector<int,_std::allocator<int>_> *)in_RDI);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff00);
  SelectionSet::clearAll((SelectionSet *)in_stack_fffffffffffffef0);
  local_81 = 0;
  SelectionManager(in_RSI,in_RDI);
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator(local_a0);
  local_90 = beginSelected(in_stack_ffffffffffffff00,
                           (int *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  while (local_90 != (StuntDouble *)0x0) {
    in_stack_ffffffffffffff27 = StuntDouble::isRigidBody(local_90);
    this_00 = local_90;
    if ((bool)in_stack_ffffffffffffff27) {
      in_stack_ffffffffffffff18 =
           (SelectionManager *)
           RigidBody::beginAtom
                     ((RigidBody *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                      (iterator *)in_stack_ffffffffffffff08);
      local_a8 = in_stack_ffffffffffffff18;
      while (local_a8 != (SelectionManager *)0x0) {
        in_stack_ffffffffffffff08 =
             std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                       (&local_28,0);
        in_stack_ffffffffffffff14 = StuntDouble::getGlobalIndex((StuntDouble *)local_a8);
        OpenMDBitSet::setBitOn(in_stack_fffffffffffffef0,(size_t)in_stack_fffffffffffffee8);
        in_stack_ffffffffffffff00 =
             (SelectionManager *)
             RigidBody::nextAtom((RigidBody *)
                                 CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                                 (iterator *)in_stack_ffffffffffffff08);
        local_a8 = in_stack_ffffffffffffff00;
      }
      in_stack_fffffffffffffef0 =
           std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                     (local_68,0);
      in_stack_fffffffffffffefc = StuntDouble::getGlobalIndex(this_00);
      OpenMDBitSet::setBitOn(in_stack_fffffffffffffef0,(size_t)in_stack_fffffffffffffee8);
    }
    in_stack_fffffffffffffee8 =
         nextSelected(in_stack_ffffffffffffff00,
                      (int *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    local_90 = in_stack_fffffffffffffee8;
  }
  SelectionSet::operator|=
            ((SelectionSet *)in_stack_fffffffffffffef0,(SelectionSet *)in_stack_fffffffffffffee8);
  SelectionSet::operator-=
            ((SelectionSet *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
             (SelectionSet *)in_stack_ffffffffffffff18);
  local_81 = 1;
  SelectionSet::~SelectionSet((SelectionSet *)0x280c60);
  SelectionSet::~SelectionSet((SelectionSet *)0x280c6d);
  return in_RDI;
}

Assistant:

SelectionManager SelectionManager::replaceRigidBodiesWithAtoms() const {
    SelectionSet ssAtoms(nObjects_);
    ssAtoms.clearAll();

    SelectionSet ssRBs(nObjects_);
    ssRBs.clearAll();

    SelectionManager tempSeleMan = *this;

    StuntDouble* sd;
    int isd;
    std::vector<Atom*>::iterator ai;
    Atom* atom;
    for (sd = tempSeleMan.beginSelected(isd); sd != NULL;
         sd = tempSeleMan.nextSelected(isd)) {
      if (sd->isRigidBody()) {
        RigidBody* rb = static_cast<RigidBody*>(sd);
        for (atom = rb->beginAtom(ai); atom != NULL; atom = rb->nextAtom(ai)) {
          ssAtoms.bitsets_[STUNTDOUBLE].setBitOn(atom->getGlobalIndex());
        }

        ssRBs.bitsets_[STUNTDOUBLE].setBitOn(rb->getGlobalIndex());
      }
    }

    // Add the atoms in rigid bodies and remove those rigid bodies from our
    // selection set.
    tempSeleMan.ss_ |= ssAtoms;
    tempSeleMan.ss_ -= ssRBs;

    return tempSeleMan;
  }